

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_lpf2_init(ma_lpf2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                      ma_lpf2 *pLPF)

{
  ma_result mVar1;
  void *pHeap;
  size_t heapSizeInBytes;
  size_t local_30;
  
  mVar1 = ma_lpf2_get_heap_size(pConfig,&local_30);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (local_30 == 0) {
    pHeap = (void *)0x0;
LAB_0019990c:
    mVar1 = ma_lpf2_init_preallocated(pConfig,pHeap,pLPF);
    if (mVar1 == MA_SUCCESS) {
      (pLPF->bq)._ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(local_30);
LAB_00199904:
      if (pHeap != (void *)0x0) goto LAB_0019990c;
    }
    else if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (*pAllocationCallbacks->onMalloc)(local_30,pAllocationCallbacks->pUserData);
      goto LAB_00199904;
    }
    mVar1 = MA_OUT_OF_MEMORY;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_lpf2_init(const ma_lpf2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_lpf2* pLPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_lpf2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_lpf2_init_preallocated(pConfig, pHeap, pLPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pLPF->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}